

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::
Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
::Matcher(Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
          *this,BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
                value)

{
  linked_ptr<const_testing::MatcherInterface<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>_>
  local_30;
  
  (this->
  super_MatcherBase<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
  ).impl_.value_ =
       (MatcherInterface<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
        *)0x0;
  (this->
  super_MatcherBase<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
  ).impl_.link_.next_ =
       &(this->
        super_MatcherBase<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
        ).impl_.link_;
  (this->
  super_MatcherBase<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001e2500;
  local_30.value_ =
       (MatcherInterface<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
        *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001e5aa8;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)
       value.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_;
  local_30.link_.next_ = &local_30.link_;
  internal::
  linked_ptr<const_testing::MatcherInterface<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>_>
  ::operator=(&(this->
               super_MatcherBase<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
               ).impl_,&local_30);
  internal::
  linked_ptr<const_testing::MatcherInterface<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>_>
  ::~linked_ptr(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }